

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t archive_acl_from_text_w(archive_acl *acl,wchar_t *text,wchar_t want_type)

{
  int iVar1;
  wchar_t wVar2;
  bool bVar3;
  wchar_t *local_f8;
  wchar_t *end;
  wchar_t *start;
  size_t sStack_e0;
  wchar_t sep;
  size_t len;
  wchar_t local_d0;
  wchar_t id;
  wchar_t permset;
  wchar_t tag;
  wchar_t types;
  wchar_t type;
  wchar_t ret;
  wchar_t sol;
  wchar_t r;
  wchar_t n;
  wchar_t fields;
  wchar_t numfields;
  wchar_t *st;
  wchar_t *s;
  anon_struct_16_2_267fbce2 name;
  anon_struct_16_2_267fbce2 field [6];
  wchar_t *pwStack_20;
  wchar_t want_type_local;
  wchar_t *text_local;
  archive_acl *acl_local;
  
  types = L'\0';
  permset = L'\0';
  field[5].end._4_4_ = want_type;
  pwStack_20 = text;
  text_local = (wchar_t *)acl;
  if ((want_type != L'Ā') && (want_type != L'Ȁ')) {
    if (want_type != L'̀') {
      if (want_type != L'㰀') {
        return L'\xffffffe2';
      }
      n = L'\x06';
      goto LAB_00319626;
    }
    field[5].end._4_4_ = L'Ā';
  }
  n = L'\x05';
LAB_00319626:
  while( true ) {
    do {
      bVar3 = false;
      if (pwStack_20 != (wchar_t *)0x0) {
        bVar3 = *pwStack_20 != L'\0';
      }
      if (!bVar3) {
        archive_acl_reset((archive_acl *)text_local,permset);
        return types;
      }
      r = L'\0';
      do {
        next_field_w(&stack0xffffffffffffffe0,&end,&local_f8,(wchar_t *)((long)&start + 4));
        if (r < n) {
          field[(long)r + -1].end = end;
          field[r].start = local_f8;
        }
        r = r + L'\x01';
        wVar2 = r;
      } while (start._4_4_ == 0x3a);
      while (sol = wVar2, sol < n) {
        field[sol].start = (wchar_t *)0x0;
        field[(long)sol + -1].end = (wchar_t *)0x0;
        wVar2 = sol + L'\x01';
      }
    } while ((name.end != (wchar_t *)0x0) && (*name.end == L'#'));
    sol = L'\0';
    type = L'\0';
    len._4_4_ = L'\xffffffff';
    local_d0 = L'\0';
    name.start = (wchar_t *)0x0;
    s = (wchar_t *)0x0;
    if (field[5].end._4_4_ != L'㰀') break;
    st = name.end;
    sStack_e0 = (long)field[0].start - (long)name.end >> 2;
    id = L'\0';
    if (4 < sStack_e0 - 4 && sStack_e0 != 9) goto switchD_00319d0b_caseD_319de4;
    switch((long)&switchD_00319d0b::switchdataD_0036fa00 +
           (long)(int)(&switchD_00319d0b::switchdataD_0036fa00)[sStack_e0 - 4]) {
    case 0x319d0d:
      iVar1 = wmemcmp(name.end,anon_var_dwarf_156d0 + 1,4);
      if (iVar1 == 0) {
        id = L'✑';
      }
      break;
    case 0x319d39:
      iVar1 = wmemcmp(name.end,anon_var_dwarf_151ce + 1,5);
      if (iVar1 == 0) {
        id = L'✓';
      }
      break;
    case 0x319d65:
      iVar1 = wmemcmp(name.end,anon_var_dwarf_b93ce,6);
      if (iVar1 == 0) {
        id = L'✒';
      }
      else {
        iVar1 = wmemcmp(st,anon_var_dwarf_b93d9,sStack_e0);
        if (iVar1 == 0) {
          id = L'✔';
        }
      }
      break;
    case 0x319dbb:
      iVar1 = wmemcmp(name.end,anon_var_dwarf_b93e4,9);
      if (iVar1 == 0) {
        id = L'❻';
      }
    case 0x319de4:
switchD_00319d0b_caseD_319de4:
    }
    if (id == L'\0') {
      types = L'\xffffffec';
    }
    else {
      if ((id == L'✑') || (id == L'✓')) {
        sol = L'\x01';
        s = field[0].end;
        name.start = field[1].start;
        isint_w(field[0].end,field[1].start,(wchar_t *)((long)&len + 4));
      }
      else {
        sol = L'\0';
      }
      wVar2 = is_nfs4_perms_w(field[(long)(sol + L'\x01') + -1].end,field[sol + L'\x01'].start,
                              &local_d0);
      if (wVar2 == L'\0') {
        types = L'\xffffffec';
      }
      else {
        wVar2 = is_nfs4_flags_w(field[(long)(sol + L'\x02') + -1].end,field[sol + L'\x02'].start,
                                &local_d0);
        if (wVar2 == L'\0') {
          types = L'\xffffffec';
        }
        else {
          st = field[(long)(sol + L'\x03') + -1].end;
          sStack_e0 = (long)field[sol + L'\x03'].start - (long)field[(long)(sol + L'\x03') + -1].end
                      >> 2;
          tag = L'\0';
          if (sStack_e0 == 4) {
            iVar1 = wmemcmp(st,anon_var_dwarf_b93fb,4);
            if (iVar1 == 0) {
              tag = L'ࠀ';
            }
          }
          else if (sStack_e0 == 5) {
            iVar1 = wmemcmp(st,anon_var_dwarf_b9406,5);
            if (iVar1 == 0) {
              tag = L'Ѐ';
            }
            else {
              iVar1 = wmemcmp(st,anon_var_dwarf_b9411,5);
              if (iVar1 == 0) {
                tag = L'က';
              }
              else {
                iVar1 = wmemcmp(st,anon_var_dwarf_b941c,5);
                if (iVar1 == 0) {
                  tag = L'\x2000';
                }
              }
            }
          }
          if (tag == L'\0') {
            types = L'\xffffffec';
          }
          else {
            isint_w(field[(long)(sol + L'\x04') + -1].end,field[sol + L'\x04'].start,
                    (wchar_t *)((long)&len + 4));
LAB_0031a090:
            ret = archive_acl_add_entry_w_len
                            ((archive_acl *)text_local,tag,local_d0,id,len._4_4_,s,
                             (long)name.start - (long)s >> 2);
            if (ret < L'\xffffffec') {
              return ret;
            }
            if (ret != L'\0') {
              types = L'\xffffffec';
            }
            permset = tag | permset;
          }
        }
      }
    }
  }
  st = name.end;
  sStack_e0 = (long)field[0].start - (long)name.end >> 2;
  if ((*name.end == L'd') &&
     ((sStack_e0 == 1 ||
      ((6 < sStack_e0 && (iVar1 = wmemcmp(name.end + 1,anon_var_dwarf_b9351,6), iVar1 == 0)))))) {
    tag = L'Ȁ';
    if (sStack_e0 < 8) {
      sol = L'\x01';
    }
    else {
      name.end = name.end + 7;
    }
  }
  else {
    tag = field[5].end._4_4_;
  }
  isint_w(field[(long)(sol + L'\x01') + -1].end,field[sol + L'\x01'].start,
          (wchar_t *)((long)&len + 4));
  if ((len._4_4_ == L'\xffffffff') && (sol + L'\x03' < r)) {
    isint_w(field[(long)(sol + L'\x03') + -1].end,field[sol + L'\x03'].start,
            (wchar_t *)((long)&len + 4));
  }
  id = L'\0';
  st = field[(long)sol + -1].end;
  _fields = field[(long)sol + -1].end + 1;
  sStack_e0 = (long)field[sol].start - (long)field[(long)sol + -1].end >> 2;
  switch(*st) {
  case L'g':
    if ((sStack_e0 == 1) ||
       ((sStack_e0 == 5 && (iVar1 = wmemcmp(_fields,anon_var_dwarf_151ce + 2,4), iVar1 == 0)))) {
      id = L'✔';
    }
    break;
  default:
    break;
  case L'm':
    if ((sStack_e0 == 1) ||
       ((sStack_e0 == 4 && (iVar1 = wmemcmp(_fields,anon_var_dwarf_b94f1 + 1,3), iVar1 == 0)))) {
      id = L'✕';
    }
    break;
  case L'o':
    if ((sStack_e0 == 1) ||
       ((sStack_e0 == 5 && (iVar1 = wmemcmp(_fields,anon_var_dwarf_b94fc + 1,4), iVar1 == 0)))) {
      id = L'✖';
    }
    break;
  case L'u':
    if ((sStack_e0 == 1) ||
       ((sStack_e0 == 4 && (iVar1 = wmemcmp(_fields,anon_var_dwarf_156d0 + 2,3), iVar1 == 0)))) {
      id = L'✒';
    }
  }
  if ((id == L'✒') || (id == L'✔')) {
    if ((len._4_4_ != L'\xffffffff') ||
       (field[(long)(sol + L'\x01') + -1].end < field[sol + L'\x01'].start)) {
      s = field[(long)(sol + L'\x01') + -1].end;
      name.start = field[sol + L'\x01'].start;
      if (id == L'✒') {
        id = L'✑';
      }
      else {
        id = L'✓';
      }
    }
  }
  else {
    if (id != L'✕' && id != L'✖') {
      types = L'\xffffffec';
      goto LAB_00319626;
    }
    if (((r == sol + L'\x02') &&
        (field[(long)(sol + L'\x01') + -1].end < field[sol + L'\x01'].start)) &&
       (wVar2 = ismode_w(field[(long)(sol + L'\x01') + -1].end,field[sol + L'\x01'].start,&local_d0)
       , wVar2 != L'\0')) {
      type = L'\x01';
    }
    else if ((r == sol + L'\x03') &&
            (field[(long)(sol + L'\x01') + -1].end < field[sol + L'\x01'].start)) {
      types = L'\xffffffec';
      goto LAB_00319626;
    }
  }
  if ((local_d0 != L'\0') ||
     (wVar2 = ismode_w(field[(long)((sol + L'\x02') - type) + -1].end,
                       field[(sol + L'\x02') - type].start,&local_d0), wVar2 != L'\0'))
  goto LAB_0031a090;
  types = L'\xffffffec';
  goto LAB_00319626;
}

Assistant:

int
archive_acl_from_text_w(struct archive_acl *acl, const wchar_t *text,
    int want_type)
{
	struct {
		const wchar_t *start;
		const wchar_t *end;
	} field[6], name;

	const wchar_t *s, *st;

	int numfields, fields, n, r, sol, ret;
	int type, types, tag, permset, id;
	size_t len;
	wchar_t sep;

	ret = ARCHIVE_OK;
	types = 0;

	switch (want_type) {
	case ARCHIVE_ENTRY_ACL_TYPE_POSIX1E:
		want_type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
		__LA_FALLTHROUGH;
	case ARCHIVE_ENTRY_ACL_TYPE_ACCESS:
	case ARCHIVE_ENTRY_ACL_TYPE_DEFAULT:
		numfields = 5;
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_NFS4:
		numfields = 6;
		break;
	default:
		return (ARCHIVE_FATAL);
	}

	while (text != NULL && *text != L'\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const wchar_t *start, *end;
			next_field_w(&text, &start, &end, &sep);
			if (fields < numfields) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == L':');

		/* Set remaining fields to blank. */
		for (n = fields; n < numfields; ++n)
			field[n].start = field[n].end = NULL;

		if (field[0].start != NULL && *(field[0].start) == L'#') {
			/* Comment, skip entry */
			continue;
		}

		n = 0;
		sol = 0;
		id = -1;
		permset = 0;
		name.start = name.end = NULL;

		if (want_type != ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			/* POSIX.1e ACLs */
			/*
			 * Default keyword "default:user::rwx"
			 * if found, we have one more field
			 *
			 * We also support old Solaris extension:
			 * "defaultuser::rwx" is the default ACL corresponding
			 * to "user::rwx", etc. valid only for first field
			 */
			s = field[0].start;
			len = field[0].end - field[0].start;
			if (*s == L'd' && (len == 1 || (len >= 7
			    && wmemcmp((s + 1), L"efault", 6) == 0))) {
				type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
				if (len > 7)
					field[0].start += 7;
				else
					n = 1;
			} else
				type = want_type;

			/* Check for a numeric ID in field n+1 or n+3. */
			isint_w(field[n + 1].start, field[n + 1].end, &id);
			/* Field n+3 is optional. */
			if (id == -1 && fields > n+3)
				isint_w(field[n + 3].start, field[n + 3].end,
				    &id);

			tag = 0;
			s = field[n].start;
			st = field[n].start + 1;
			len = field[n].end - field[n].start;

			switch (*s) {
			case L'u':
				if (len == 1 || (len == 4
				    && wmemcmp(st, L"ser", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				break;
			case L'g':
				if (len == 1 || (len == 5
				    && wmemcmp(st, L"roup", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case L'o':
				if (len == 1 || (len == 5
				    && wmemcmp(st, L"ther", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_OTHER;
				break;
			case L'm':
				if (len == 1 || (len == 4
				    && wmemcmp(st, L"ask", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_MASK;
				break;
			default:
					break;
			}

			switch (tag) {
			case ARCHIVE_ENTRY_ACL_OTHER:
			case ARCHIVE_ENTRY_ACL_MASK:
				if (fields == (n + 2)
				    && field[n + 1].start < field[n + 1].end
				    && ismode_w(field[n + 1].start,
				    field[n + 1].end, &permset)) {
					/* This is Solaris-style "other:rwx" */
					sol = 1;
				} else if (fields == (n + 3) &&
				    field[n + 1].start < field[n + 1].end) {
					/* Invalid mask or other field */
					ret = ARCHIVE_WARN;
					continue;
				}
				break;
			case ARCHIVE_ENTRY_ACL_USER_OBJ:
			case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
				if (id != -1 ||
				    field[n + 1].start < field[n + 1].end) {
					name = field[n + 1];
					if (tag == ARCHIVE_ENTRY_ACL_USER_OBJ)
						tag = ARCHIVE_ENTRY_ACL_USER;
					else
						tag = ARCHIVE_ENTRY_ACL_GROUP;
				}
				break;
			default:
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}

			/*
			 * Without "default:" we expect mode in field 2
			 * Exception: Solaris other and mask fields
			 */
			if (permset == 0 && !ismode_w(field[n + 2 - sol].start,
			    field[n + 2 - sol].end, &permset)) {
				/* Invalid mode, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
		} else {
			/* NFS4 ACLs */
			s = field[0].start;
			len = field[0].end - field[0].start;
			tag = 0;

			switch (len) {
			case 4:
				if (wmemcmp(s, L"user", 4) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER;
				break;
			case 5:
				if (wmemcmp(s, L"group", 5) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP;
				break;
			case 6:
				if (wmemcmp(s, L"owner@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				else if (wmemcmp(s, L"group@", len) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 9:
				if (wmemcmp(s, L"everyone@", 9) == 0)
					tag = ARCHIVE_ENTRY_ACL_EVERYONE;
			default:
				break;
			}

			if (tag == 0) {
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			} else if (tag == ARCHIVE_ENTRY_ACL_USER ||
			    tag == ARCHIVE_ENTRY_ACL_GROUP) {
				n = 1;
				name = field[1];
				isint_w(name.start, name.end, &id);
			} else
				n = 0;

			if (!is_nfs4_perms_w(field[1 + n].start,
			    field[1 + n].end, &permset)) {
				/* Invalid NFSv4 perms, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			if (!is_nfs4_flags_w(field[2 + n].start,
			    field[2 + n].end, &permset)) {
				/* Invalid NFSv4 flags, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			s = field[3 + n].start;
			len = field[3 + n].end - field[3 + n].start;
			type = 0;
			if (len == 4) {
				if (wmemcmp(s, L"deny", 4) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_DENY;
			} else if (len == 5) {
				if (wmemcmp(s, L"allow", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALLOW;
				else if (wmemcmp(s, L"audit", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_AUDIT;
				else if (wmemcmp(s, L"alarm", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALARM;
			}
			if (type == 0) {
				/* Invalid entry type, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			isint_w(field[4 + n].start, field[4 + n].end, &id);
		}

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_w_len(acl, type, permset,
		    tag, id, name.start, name.end - name.start);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
		types |= type;
	}

	/* Reset ACL */
	archive_acl_reset(acl, types);

	return (ret);
}